

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

size_t chck_buffer_read(void *dst,size_t size,size_t memb,chck_buffer *buf)

{
  _Bool _Var1;
  ulong local_38;
  size_t nsz;
  chck_buffer *buf_local;
  size_t memb_local;
  size_t size_local;
  void *dst_local;
  
  nsz = (size_t)buf;
  buf_local = (chck_buffer *)memb;
  memb_local = size;
  size_local = (size_t)dst;
  if ((dst != (void *)0x0) && (buf != (chck_buffer *)0x0)) {
    _Var1 = chck_mul_ofsz(size,memb,&local_38);
    if (_Var1) {
      dst_local = (void *)0x0;
    }
    else {
      if ((ulong)(*(long *)(nsz + 0x10) - (*(long *)(nsz + 8) - *(long *)nsz)) < local_38) {
        if (memb_local == 0) {
          __assert_fail("size != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                        ,0x113,
                        "size_t chck_buffer_read(void *, size_t, size_t, struct chck_buffer *)");
        }
        buf_local = (chck_buffer *)
                    ((ulong)(*(long *)(nsz + 0x10) - (*(long *)(nsz + 8) - *(long *)nsz)) /
                    memb_local);
      }
      memcpy((void *)size_local,*(void **)(nsz + 8),memb_local * (long)buf_local);
      *(size_t *)(nsz + 8) = memb_local * (long)buf_local + *(long *)(nsz + 8);
      dst_local = buf_local;
    }
    return (size_t)dst_local;
  }
  __assert_fail("dst && buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x10c,"size_t chck_buffer_read(void *, size_t, size_t, struct chck_buffer *)");
}

Assistant:

size_t
chck_buffer_read(void *dst, size_t size, size_t memb, struct chck_buffer *buf)
{
   assert(dst && buf);

   size_t nsz;
   if (unlikely(chck_mul_ofsz(size, memb, &nsz)))
      return 0;

   if (unlikely(nsz > buf->size - (buf->curpos - buf->buffer))) {
      assert(size != 0); // should never happen
      // read as much as we can
      memb = (buf->size - (buf->curpos - buf->buffer)) / size;
   }

   memcpy(dst, buf->curpos, size * memb);
   buf->curpos += size * memb;
   return memb;
}